

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void direct_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  uint16_t address_00;
  cs_m680x_op *op;
  
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  op = (info->m680x).operands + bVar1;
  op->type = M680X_OP_DIRECT;
  set_operand_size(info,op,(uint8_t)address);
  address_00 = *address;
  *address = address_00 + 1;
  read_byte(info,&(info->m680x).operands[bVar1].field_1.direct_addr,address_00);
  return;
}

Assistant:

static void direct_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_DIRECT;
	set_operand_size(info, op, 1);
	read_byte(info, &op->direct_addr, (*address)++);
}